

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_backend_test.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  tcp_cache_service *ptVar2;
  exception *e;
  vector<int,_std::allocator<int>_> ports;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  srv2;
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  srv1;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_00000b68;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_00000b70;
  undefined1 in_stack_000036ff;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_00003700;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd7c;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  base_cache *in_stack_fffffffffffffd88;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  undefined1 local_190 [8];
  undefined1 local_188 [8];
  undefined1 local_180 [8];
  undefined1 local_178 [8];
  undefined1 local_170 [8];
  undefined1 local_168 [8];
  undefined1 local_160 [8];
  undefined4 local_158;
  allocator local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  undefined1 local_d8 [14];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  undefined4 local_90;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [24];
  undefined1 local_50 [40];
  undefined1 local_28 [8];
  undefined1 local_20 [28];
  undefined4 local_4;
  
  local_4 = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing thread cache... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  cppcms::impl::thread_cache_factory((uint)local_20);
  test_cache(in_stack_00003700,(bool)in_stack_000036ff);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing process cache... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  cppcms::impl::process_cache_factory((ulong)local_28,0x1000000);
  test_cache(in_stack_00003700,(bool)in_stack_000036ff);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,std::default_delete<cppcms::impl::tcp_cache_service>>::
  unique_ptr<std::default_delete<cppcms::impl::tcp_cache_service>,void>
            ((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
              *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,std::default_delete<cppcms::impl::tcp_cache_service>>::
  unique_ptr<std::default_delete<cppcms::impl::tcp_cache_service>,void>
            ((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
              *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing cache over ip, single server... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10f6d7);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10f6e4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"127.0.0.1",&local_89);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
              (value_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_90 = 0x1771;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  ptVar2 = (tcp_cache_service *)operator_new(8);
  local_ca = 1;
  cppcms::impl::thread_cache_factory((uint)local_98);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x10f7a7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"127.0.0.1",&local_c9);
  uVar3 = 10;
  cppcms::impl::tcp_cache_service::tcp_cache_service(ptVar2,local_98,local_a8,1,local_c8,0x1771);
  local_ca = 0;
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::reset((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
           *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
          (pointer)CONCAT44(in_stack_fffffffffffffd7c,uVar3));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x10f859);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)in_stack_fffffffffffffd87);
  cppcms::impl::tcp_cache_factory(local_d8,local_50,local_68,local_e0);
  test_cache(in_stack_00003700,(bool)in_stack_000036ff);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing cache over ip, single server with L1 cache... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  cppcms::impl::thread_cache_factory((uint)local_f0);
  cppcms::impl::tcp_cache_factory(local_e8,local_50,local_68,local_f0);
  test_cache(in_stack_00003700,(bool)in_stack_000036ff);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ptVar2 = (tcp_cache_service *)operator_new(8);
  local_12a = 1;
  cppcms::impl::thread_cache_factory((uint)local_f8);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x10f9fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"127.0.0.1",&local_129);
  uVar3 = 10;
  cppcms::impl::tcp_cache_service::tcp_cache_service(ptVar2,local_f8,local_108,1,local_128,0x1772);
  local_12a = 0;
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::reset((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
           *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
          (pointer)CONCAT44(in_stack_fffffffffffffd7c,uVar3));
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x10faa3);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"127.0.0.1",&local_151);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
              (value_type *)CONCAT44(in_stack_fffffffffffffd7c,uVar3));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_158 = 0x1772;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffd7c,uVar3));
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing cache over ip, multiple server... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)in_stack_fffffffffffffd87);
  cppcms::impl::tcp_cache_factory(local_160,local_50,local_68,local_168);
  test_cache(in_stack_00003700,(bool)in_stack_000036ff);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing cache over ip, multiple server with L1 cache... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  cppcms::impl::thread_cache_factory((uint)local_178);
  cppcms::impl::tcp_cache_factory(local_170,local_50,local_68,local_178);
  test_cache(in_stack_00003700,(bool)in_stack_000036ff);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing two clients... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  cppcms::impl::thread_cache_factory((uint)local_188);
  cppcms::impl::tcp_cache_factory(local_180,local_50,local_68,local_188);
  cppcms::impl::thread_cache_factory((uint)local_198);
  cppcms::impl::tcp_cache_factory(local_190,local_50,local_68,local_198);
  test_two_clients(in_stack_00000b70,in_stack_00000b68);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing two clients with L1 cache... ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)in_stack_fffffffffffffd87);
  cppcms::impl::tcp_cache_factory(local_1a0,local_50,local_68,local_1a8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)in_stack_fffffffffffffd87);
  cppcms::impl::tcp_cache_factory(local_1b0,local_50,local_68,local_1b8);
  test_two_clients(in_stack_00000b70,in_stack_00000b68);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)poVar1);
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::operator->((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
                *)0x110493);
  cppcms::impl::tcp_cache_service::stop();
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::operator->((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
                *)0x1104aa);
  cppcms::impl::tcp_cache_service::stop();
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::~unique_ptr((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
                 *)poVar1);
  std::
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  ::~unique_ptr((unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
                 *)poVar1);
  return 0;
}

Assistant:

int main()
{
	typedef booster::shared_ptr<cppcms::sessions::session_storage_factory> sfact_type;
	try {
		std::cout << "Testing thread cache... "<< std::flush;
		test_cache(cppcms::impl::thread_cache_factory(20));
		std::cout << "Ok" << std::endl;
		#if !defined(CPPCMS_WIN32) && !defined(CPPCMS_NO_PREFOK_CACHE)
		std::cout << "Testing process cache... " << std::flush;
		test_cache(cppcms::impl::process_cache_factory(16*1024*1024,20));
		std::cout << "Ok" << std::endl;
		#endif
		
		std::unique_ptr<cppcms::impl::tcp_cache_service> srv1,srv2;
		{
			try {
				std::cout << "Testing cache over ip, single server... "<<std::flush;
				std::vector<std::string> ips;
				std::vector<int> ports;
				ips.push_back("127.0.0.1");
				ports.push_back(6001);
				srv1.reset(new cppcms::impl::tcp_cache_service(
							cppcms::impl::thread_cache_factory(20),
							sfact_type(),
							1,"127.0.0.1",6001));

				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,0),false);
				std::cout << "Ok" << std::endl;
				std::cout << "Testing cache over ip, single server with L1 cache... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),false);
				std::cout << "Ok" << std::endl;
				srv2.reset(new cppcms::impl::tcp_cache_service(
						cppcms::impl::thread_cache_factory(20),
						sfact_type(),
						1,"127.0.0.1",6002));
				ips.push_back("127.0.0.1");
				ports.push_back(6002);
				std::cout << "Testing cache over ip, multiple server... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,0),false);
				std::cout << "Ok" << std::endl;
				std::cout << "Testing cache over ip, multiple server with L1 cache... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),false);
				std::cout << "Ok" <<std::endl;
				ips.resize(1);
				ports.resize(1);
				std::cout << "Testing two clients... "<<std::flush;
				test_two_clients(
					cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),
					cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)));
				std::cout << "Ok" <<std::endl;
				std::cout << "Testing two clients with L1 cache... "<<std::flush;
				test_two_clients(
					cppcms::impl::tcp_cache_factory(ips,ports,0),
					cppcms::impl::tcp_cache_factory(ips,ports,0));
				std::cout << "Ok" <<std::endl;
					
			}
			catch(...) {
				if(srv1.get()) {
					srv1->stop();
					srv1.reset();
				}
				if(srv2.get()) {
					srv2->stop();
					srv2.reset();
				}
				throw;
			}
			srv1->stop();	
			srv2->stop();
			
		}

	}
	catch(std::exception const &e) {
		std::cerr << "\nFail " << e.what() << std::endl;
		return 1;
	}
	return 0;

}